

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

bool __thiscall BufferedReader::incSeek(BufferedReader *this,int readerID,int64_t offset)

{
  _Base_ptr p_Var1;
  char cVar2;
  iterator iVar3;
  bool bVar4;
  int local_2c;
  
  local_2c = readerID;
  std::mutex::lock(&this->m_readersMtx);
  iVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
          ::find(&(this->m_readers)._M_t,&local_2c);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->m_readers)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = iVar3._M_node[1]._M_parent;
    cVar2 = (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,offset);
    if (cVar2 != '\0') {
      *(undefined1 *)((long)&p_Var1->_M_left + 3) = 0;
      *(undefined1 *)((long)&p_Var1->_M_parent + 1) = 0;
      bVar4 = true;
      goto LAB_00193a96;
    }
  }
  bVar4 = false;
LAB_00193a96:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return bVar4;
}

Assistant:

bool BufferedReader::incSeek(const int readerID, const int64_t offset)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    if (itr != m_readers.end())
    {
        ReaderData* data = itr->second;
        const bool rez = data->incSeek(offset);
        if (rez)
        {
            data->m_eof = false;
            data->m_notified = false;
        }
        return rez;
    }
    return false;
}